

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_object.cpp
# Opt level: O3

object_ptr __thiscall
mjs::make_array(mjs *this,gc_heap_ptr<mjs::global_object> *global,
               vector<mjs::value,_std::allocator<mjs::value>_> *args)

{
  pointer pvVar1;
  gc_heap *h;
  long *plVar2;
  global_object *g;
  mjs *pmVar3;
  uint32_t index;
  undefined8 extraout_RDX;
  wstring *this_00;
  mjs *this_01;
  object_ptr oVar4;
  gc_heap_ptr<mjs::array_object> arr;
  object_ptr array_prototype;
  wstring local_90;
  wstring local_70;
  gc_heap_ptr_untyped local_50;
  gc_heap_ptr_untyped local_40;
  
  plVar2 = (long *)gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
  (**(code **)(*plVar2 + 0x70))(&local_50,plVar2);
  pvVar1 = (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (((long)(args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
             super__Vector_impl_data._M_finish - (long)pvVar1 == 0x28) && (pvVar1->type_ == number))
  {
    g = (global_object *)gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
    pvVar1 = (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if (pvVar1->type_ != number) {
      __assert_fail("type_ == value_type::number",
                    "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/value.h",
                    0x44,"double mjs::value::number_value() const");
    }
    anon_unknown_110::check_array_length(g,(pvVar1->field_1).n_);
    array_object::make((gc_heap_ptr<mjs::global_object> *)&local_90,(uint32_t)global);
    *(pointer *)this = local_90._M_dataplus._M_p;
    *(undefined4 *)(this + 8) = (undefined4)local_90._M_string_length;
    if ((gc_heap *)local_90._M_dataplus._M_p != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_90._M_dataplus._M_p,(gc_heap_ptr_untyped *)this);
    }
    this_00 = &local_90;
  }
  else {
    array_object::make((gc_heap_ptr<mjs::global_object> *)&local_70,(uint32_t)global);
    if ((args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
        super__Vector_impl_data._M_finish !=
        (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
        super__Vector_impl_data._M_start) {
      this_01 = (mjs *)0x0;
      do {
        plVar2 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_70);
        h = (global->super_gc_heap_ptr_untyped).heap_;
        index_string_abi_cxx11_(&local_90,this_01,index);
        local_70.field_2._8_8_ = local_90._M_dataplus._M_p;
        string::string((string *)&local_40,h,(wstring_view *)&local_70.field_2);
        (**(code **)(*plVar2 + 8))
                  (plVar2,&local_40,
                   (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
                   super__Vector_impl_data._M_start + (long)this_01,0);
        gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_40);
        if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity * 4 + 4);
        }
        this_01 = (mjs *)(ulong)((int)this_01 + 1);
        pmVar3 = (mjs *)(((long)(args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>).
                                _M_impl.super__Vector_impl_data._M_finish -
                          (long)(args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>).
                                _M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333
                        );
      } while (this_01 <= pmVar3 && (long)pmVar3 - (long)this_01 != 0);
    }
    *(pointer *)this = local_70._M_dataplus._M_p;
    *(undefined4 *)(this + 8) = (undefined4)local_70._M_string_length;
    if ((gc_heap *)local_70._M_dataplus._M_p != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_70._M_dataplus._M_p,(gc_heap_ptr_untyped *)this);
    }
    this_00 = &local_70;
  }
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)this_00);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_50);
  oVar4.super_gc_heap_ptr_untyped._8_8_ = extraout_RDX;
  oVar4.super_gc_heap_ptr_untyped.heap_ = (gc_heap *)this;
  return (object_ptr)oVar4.super_gc_heap_ptr_untyped;
}

Assistant:

object_ptr make_array(const gc_heap_ptr<global_object>& global, const std::vector<value>& args) {
    auto array_prototype = global->array_prototype();
    if (args.size() == 1 && args[0].type() == value_type::number) {
        return array_object::make(global, check_array_length(*global, args[0].number_value()));
    }
    auto arr = array_object::make(global, static_cast<uint32_t>(args.size()));
    for (uint32_t i = 0; i < args.size(); ++i) {
        arr->put(string{global.heap(), index_string(i)}, args[i], property_attribute::none);
    }
    return arr;
}